

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

idx_t duckdb_union_type_member_count(duckdb_logical_type type)

{
  idx_t iVar1;
  idx_t iVar2;
  
  if ((type != (duckdb_logical_type)0x0) && (*type == (_duckdb_logical_type)0x6b)) {
    iVar1 = duckdb_struct_type_child_count(type);
    iVar2 = iVar1 - 1;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    return iVar2;
  }
  return 0;
}

Assistant:

idx_t duckdb_union_type_member_count(duckdb_logical_type type) {
	if (!AssertLogicalTypeId(type, duckdb::LogicalTypeId::UNION)) {
		return 0;
	}
	idx_t member_count = duckdb_struct_type_child_count(type);
	if (member_count != 0) {
		member_count--;
	}
	return member_count;
}